

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  bool bVar14;
  int iVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Option opt_q;
  Mat local_1b8;
  size_t local_170;
  char local_165;
  int local_164;
  Mat *local_160;
  undefined1 local_158 [44];
  int iStack_12c;
  undefined8 uStack_128;
  int local_120;
  size_t local_118;
  undefined1 local_108 [44];
  int iStack_dc;
  undefined8 uStack_d8;
  int local_d0;
  size_t local_c8;
  undefined1 local_b8 [48];
  undefined8 uStack_88;
  int local_80;
  size_t local_78;
  Option local_70;
  
  if (this->dynamic_weight != 0) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_1b8,mb,(ulong)(uint)this->weight_data_size,0);
  local_160 = &this->weight_data;
  if (local_160 != &local_1b8) {
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->weight_data).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->weight_data).data;
        pAVar5 = (this->weight_data).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).cstep = 0;
    *(undefined8 *)((long)&local_160->refcount + 4) = 0;
    *(undefined8 *)((long)&local_160->elemsize + 4) = 0;
    local_160->data = (void *)0x0;
    local_160->refcount = (int *)0x0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).d = 0;
    (this->weight_data).c = 0;
    (this->weight_data).data = local_1b8.data;
    (this->weight_data).refcount =
         (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    (this->weight_data).elemsize = local_1b8.elemsize;
    (this->weight_data).elempack = local_1b8.elempack;
    (this->weight_data).allocator = local_1b8.allocator;
    (this->weight_data).dims = local_1b8.dims;
    (this->weight_data).w = local_1b8.w;
    (this->weight_data).h = local_1b8.h;
    (this->weight_data).d = local_1b8.d;
    (this->weight_data).c = local_1b8.c;
    (this->weight_data).cstep = local_1b8.cstep;
  }
  piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_160->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_1b8,mb,(ulong)(uint)this->num_output,1);
    pMVar1 = &this->bias_data;
    if (pMVar1 != &local_1b8) {
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->bias_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bias_data).data;
          pAVar5 = (this->bias_data).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_data).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->bias_data).refcount + 4) = (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->bias_data).dims = 0;
      (this->bias_data).w = 0;
      (this->bias_data).h = 0;
      (this->bias_data).d = 0;
      (this->bias_data).c = 0;
      (this->bias_data).data = local_1b8.data;
      (this->bias_data).refcount =
           (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      (this->bias_data).elemsize = local_1b8.elemsize;
      (this->bias_data).elempack = local_1b8.elempack;
      (this->bias_data).allocator = local_1b8.allocator;
      (this->bias_data).dims = local_1b8.dims;
      (this->bias_data).w = local_1b8.w;
      (this->bias_data).h = local_1b8.h;
      (this->bias_data).d = local_1b8.d;
      (this->bias_data).c = local_1b8.c;
      (this->bias_data).cstep = local_1b8.cstep;
    }
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (pMVar1->data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  iVar17 = this->int8_scale_term;
  if (iVar17 < 0x65) {
    if (iVar17 == 1) {
LAB_00404010:
      (*mb->_vptr_ModelBin[2])(&local_1b8,mb,(ulong)(uint)this->group,1);
      pMVar1 = &this->weight_data_int8_scales;
      if (pMVar1 != &local_1b8) {
        piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->weight_data_int8_scales).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->weight_data_int8_scales).data;
            pAVar5 = (this->weight_data_int8_scales).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_int8_scales).cstep = 0;
        *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_int8_scales).dims = 0;
        (this->weight_data_int8_scales).w = 0;
        (this->weight_data_int8_scales).h = 0;
        (this->weight_data_int8_scales).d = 0;
        (this->weight_data_int8_scales).c = 0;
        (this->weight_data_int8_scales).data = local_1b8.data;
        (this->weight_data_int8_scales).refcount =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        (this->weight_data_int8_scales).elemsize = local_1b8.elemsize;
        (this->weight_data_int8_scales).elempack = local_1b8.elempack;
        (this->weight_data_int8_scales).allocator = local_1b8.allocator;
        (this->weight_data_int8_scales).dims = local_1b8.dims;
        (this->weight_data_int8_scales).w = local_1b8.w;
        (this->weight_data_int8_scales).h = local_1b8.h;
        (this->weight_data_int8_scales).d = local_1b8.d;
        (this->weight_data_int8_scales).c = local_1b8.c;
        (this->weight_data_int8_scales).cstep = local_1b8.cstep;
      }
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*mb->_vptr_ModelBin[2])(&local_1b8,mb,1);
      pMVar1 = &this->bottom_blob_int8_scales;
      if (pMVar1 != &local_1b8) {
        piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->bottom_blob_int8_scales).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->bottom_blob_int8_scales).data;
            pAVar5 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->bottom_blob_int8_scales).cstep = 0;
        *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).d = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = local_1b8.data;
        (this->bottom_blob_int8_scales).refcount =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        (this->bottom_blob_int8_scales).elemsize = local_1b8.elemsize;
        (this->bottom_blob_int8_scales).elempack = local_1b8.elempack;
        (this->bottom_blob_int8_scales).allocator = local_1b8.allocator;
        (this->bottom_blob_int8_scales).dims = local_1b8.dims;
        (this->bottom_blob_int8_scales).w = local_1b8.w;
        (this->bottom_blob_int8_scales).h = local_1b8.h;
        (this->bottom_blob_int8_scales).d = local_1b8.d;
        (this->bottom_blob_int8_scales).c = local_1b8.c;
        (this->bottom_blob_int8_scales).cstep = local_1b8.cstep;
      }
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_170 = CONCAT44(local_170._4_4_,*(this->bottom_blob_int8_scales).data);
      local_1b8.cstep = 0;
      local_1b8.data = (void *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize = 0;
      local_1b8.elempack = 0;
      local_1b8.allocator = (Allocator *)0x0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      Mat::create(&local_1b8,this->group,4,(Allocator *)0x0);
      if (pMVar1 != &local_1b8) {
        piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->bottom_blob_int8_scales).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->bottom_blob_int8_scales).data;
            pAVar5 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->bottom_blob_int8_scales).cstep = 0;
        *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).d = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = local_1b8.data;
        (this->bottom_blob_int8_scales).refcount =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        (this->bottom_blob_int8_scales).elemsize = local_1b8.elemsize;
        (this->bottom_blob_int8_scales).elempack = local_1b8.elempack;
        (this->bottom_blob_int8_scales).allocator = local_1b8.allocator;
        (this->bottom_blob_int8_scales).dims = local_1b8.dims;
        (this->bottom_blob_int8_scales).w = local_1b8.w;
        (this->bottom_blob_int8_scales).h = local_1b8.h;
        (this->bottom_blob_int8_scales).d = local_1b8.d;
        (this->bottom_blob_int8_scales).c = local_1b8.c;
        (this->bottom_blob_int8_scales).cstep = local_1b8.cstep;
      }
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      auVar8 = _DAT_005f2a10;
      auVar7 = _DAT_005ef050;
      auVar6 = _DAT_005ef040;
      local_1b8.cstep = 0;
      local_1b8.data = (void *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize = 0;
      local_1b8.elempack = 0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      uVar9 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
      if (0 < (int)uVar9) {
        pvVar4 = pMVar1->data;
        lVar10 = (ulong)uVar9 - 1;
        auVar23._8_4_ = (int)lVar10;
        auVar23._0_8_ = lVar10;
        auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar23 = auVar23 ^ _DAT_005ef050;
        do {
          auVar19._8_4_ = (int)uVar11;
          auVar19._0_8_ = uVar11;
          auVar19._12_4_ = (int)(uVar11 >> 0x20);
          auVar18 = (auVar19 | auVar6) ^ auVar7;
          iVar17 = auVar23._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar17 && auVar23._0_4_ < auVar18._0_4_ ||
                      iVar17 < auVar18._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar4 + uVar11 * 4) = (undefined4)local_170;
          }
          if ((auVar18._12_4_ != auVar23._12_4_ || auVar18._8_4_ <= auVar23._8_4_) &&
              auVar18._12_4_ <= auVar23._12_4_) {
            *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = (undefined4)local_170;
          }
          auVar19 = (auVar19 | auVar8) ^ auVar7;
          iVar24 = auVar19._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar19._0_4_ <= auVar23._0_4_)) {
            *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = (undefined4)local_170;
            *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = (undefined4)local_170;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar9 + 3 & 0xfffffffc) != uVar11);
      }
      goto LAB_00404c9d;
    }
    if (iVar17 != 2) goto LAB_00404c9d;
  }
  else if (iVar17 != 0x66) {
    if (iVar17 != 0x65) goto LAB_00404c9d;
    goto LAB_00404010;
  }
  (*mb->_vptr_ModelBin[2])(&local_1b8,mb,1,1);
  pMVar1 = &this->weight_data_int8_scales;
  if (pMVar1 != &local_1b8) {
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->weight_data_int8_scales).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->weight_data_int8_scales).data;
        pAVar5 = (this->weight_data_int8_scales).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar1->data = (void *)0x0;
    pMVar1->refcount = (int *)0x0;
    (this->weight_data_int8_scales).dims = 0;
    (this->weight_data_int8_scales).w = 0;
    (this->weight_data_int8_scales).h = 0;
    (this->weight_data_int8_scales).d = 0;
    (this->weight_data_int8_scales).c = 0;
    (this->weight_data_int8_scales).data = local_1b8.data;
    (this->weight_data_int8_scales).refcount =
         (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    (this->weight_data_int8_scales).elemsize = local_1b8.elemsize;
    (this->weight_data_int8_scales).elempack = local_1b8.elempack;
    (this->weight_data_int8_scales).allocator = local_1b8.allocator;
    (this->weight_data_int8_scales).dims = local_1b8.dims;
    (this->weight_data_int8_scales).w = local_1b8.w;
    (this->weight_data_int8_scales).h = local_1b8.h;
    (this->weight_data_int8_scales).d = local_1b8.d;
    (this->weight_data_int8_scales).c = local_1b8.c;
    (this->weight_data_int8_scales).cstep = local_1b8.cstep;
  }
  piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  (*mb->_vptr_ModelBin[2])(&local_1b8,mb,1);
  pMVar2 = &this->bottom_blob_int8_scales;
  if (pMVar2 != &local_1b8) {
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->bottom_blob_int8_scales).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->bottom_blob_int8_scales).data;
        pAVar5 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->bottom_blob_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar2->data = (void *)0x0;
    pMVar2->refcount = (int *)0x0;
    (this->bottom_blob_int8_scales).dims = 0;
    (this->bottom_blob_int8_scales).w = 0;
    (this->bottom_blob_int8_scales).h = 0;
    (this->bottom_blob_int8_scales).d = 0;
    (this->bottom_blob_int8_scales).c = 0;
    (this->bottom_blob_int8_scales).data = local_1b8.data;
    (this->bottom_blob_int8_scales).refcount =
         (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    (this->bottom_blob_int8_scales).elemsize = local_1b8.elemsize;
    (this->bottom_blob_int8_scales).elempack = local_1b8.elempack;
    (this->bottom_blob_int8_scales).allocator = local_1b8.allocator;
    (this->bottom_blob_int8_scales).dims = local_1b8.dims;
    (this->bottom_blob_int8_scales).w = local_1b8.w;
    (this->bottom_blob_int8_scales).h = local_1b8.h;
    (this->bottom_blob_int8_scales).d = local_1b8.d;
    (this->bottom_blob_int8_scales).c = local_1b8.c;
    (this->bottom_blob_int8_scales).cstep = local_1b8.cstep;
  }
  piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_170 = CONCAT44(local_170._4_4_,*(this->weight_data_int8_scales).data);
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  Mat::create(&local_1b8,this->group,4,(Allocator *)0x0);
  if (pMVar1 != &local_1b8) {
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->weight_data_int8_scales).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->weight_data_int8_scales).data;
        pAVar5 = (this->weight_data_int8_scales).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar1->data = (void *)0x0;
    pMVar1->refcount = (int *)0x0;
    (this->weight_data_int8_scales).dims = 0;
    (this->weight_data_int8_scales).w = 0;
    (this->weight_data_int8_scales).h = 0;
    (this->weight_data_int8_scales).d = 0;
    (this->weight_data_int8_scales).c = 0;
    (this->weight_data_int8_scales).data = local_1b8.data;
    (this->weight_data_int8_scales).refcount =
         (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    (this->weight_data_int8_scales).elemsize = local_1b8.elemsize;
    (this->weight_data_int8_scales).elempack = local_1b8.elempack;
    (this->weight_data_int8_scales).allocator = local_1b8.allocator;
    (this->weight_data_int8_scales).dims = local_1b8.dims;
    (this->weight_data_int8_scales).w = local_1b8.w;
    (this->weight_data_int8_scales).h = local_1b8.h;
    (this->weight_data_int8_scales).d = local_1b8.d;
    (this->weight_data_int8_scales).c = local_1b8.c;
    (this->weight_data_int8_scales).cstep = local_1b8.cstep;
  }
  piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  auVar8 = _DAT_005f2a10;
  auVar7 = _DAT_005ef050;
  auVar6 = _DAT_005ef040;
  uVar9 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
  if (0 < (int)uVar9) {
    pvVar4 = pMVar1->data;
    lVar10 = (ulong)uVar9 - 1;
    auVar18._8_4_ = (int)lVar10;
    auVar18._0_8_ = lVar10;
    auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar11 = 0;
    auVar18 = auVar18 ^ _DAT_005ef050;
    do {
      auVar22._8_4_ = (int)uVar11;
      auVar22._0_8_ = uVar11;
      auVar22._12_4_ = (int)(uVar11 >> 0x20);
      auVar23 = (auVar22 | auVar6) ^ auVar7;
      iVar17 = auVar18._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar17 && auVar18._0_4_ < auVar23._0_4_ ||
                  iVar17 < auVar23._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4) = (undefined4)local_170;
      }
      if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
          auVar23._12_4_ <= auVar18._12_4_) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = (undefined4)local_170;
      }
      auVar23 = (auVar22 | auVar8) ^ auVar7;
      iVar24 = auVar23._4_4_;
      if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar23._0_4_ <= auVar18._0_4_)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = (undefined4)local_170;
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = (undefined4)local_170;
      }
      uVar11 = uVar11 + 4;
    } while ((uVar9 + 3 & 0xfffffffc) != uVar11);
  }
  local_170 = CONCAT44(local_170._4_4_,*(this->bottom_blob_int8_scales).data);
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  Mat::create(&local_1b8,this->group,4,(Allocator *)0x0);
  if (pMVar2 != &local_1b8) {
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->bottom_blob_int8_scales).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->bottom_blob_int8_scales).data;
        pAVar5 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->bottom_blob_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar2->data = (void *)0x0;
    pMVar2->refcount = (int *)0x0;
    (this->bottom_blob_int8_scales).dims = 0;
    (this->bottom_blob_int8_scales).w = 0;
    (this->bottom_blob_int8_scales).h = 0;
    (this->bottom_blob_int8_scales).d = 0;
    (this->bottom_blob_int8_scales).c = 0;
    (this->bottom_blob_int8_scales).data = local_1b8.data;
    (this->bottom_blob_int8_scales).refcount =
         (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    (this->bottom_blob_int8_scales).elemsize = local_1b8.elemsize;
    (this->bottom_blob_int8_scales).elempack = local_1b8.elempack;
    (this->bottom_blob_int8_scales).allocator = local_1b8.allocator;
    (this->bottom_blob_int8_scales).dims = local_1b8.dims;
    (this->bottom_blob_int8_scales).w = local_1b8.w;
    (this->bottom_blob_int8_scales).h = local_1b8.h;
    (this->bottom_blob_int8_scales).d = local_1b8.d;
    (this->bottom_blob_int8_scales).c = local_1b8.c;
    (this->bottom_blob_int8_scales).cstep = local_1b8.cstep;
  }
  piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  auVar8 = _DAT_005f2a10;
  auVar7 = _DAT_005ef050;
  auVar6 = _DAT_005ef040;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  uVar9 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
  if (0 < (int)uVar9) {
    pvVar4 = pMVar2->data;
    lVar10 = (ulong)uVar9 - 1;
    auVar15._8_4_ = (int)lVar10;
    auVar15._0_8_ = lVar10;
    auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar11 = 0;
    auVar15 = auVar15 ^ _DAT_005ef050;
    do {
      auVar20._8_4_ = (int)uVar11;
      auVar20._0_8_ = uVar11;
      auVar20._12_4_ = (int)(uVar11 >> 0x20);
      auVar23 = (auVar20 | auVar6) ^ auVar7;
      iVar17 = auVar15._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar17 && auVar15._0_4_ < auVar23._0_4_ ||
                  iVar17 < auVar23._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4) = (undefined4)local_170;
      }
      if ((auVar23._12_4_ != auVar15._12_4_ || auVar23._8_4_ <= auVar15._8_4_) &&
          auVar23._12_4_ <= auVar15._12_4_) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = (undefined4)local_170;
      }
      auVar23 = (auVar20 | auVar8) ^ auVar7;
      iVar24 = auVar23._4_4_;
      if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar23._0_4_ <= auVar15._0_4_)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = (undefined4)local_170;
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = (undefined4)local_170;
      }
      uVar11 = uVar11 + 4;
    } while ((uVar9 + 3 & 0xfffffffc) != uVar11);
  }
LAB_00404c9d:
  if (100 < this->int8_scale_term) {
    (*mb->_vptr_ModelBin[2])(&local_1b8,mb,1);
    pMVar1 = &this->top_blob_int8_scales;
    if (pMVar1 != &local_1b8) {
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->top_blob_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->top_blob_int8_scales).data;
          pAVar5 = (this->top_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->top_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->top_blob_int8_scales).dims = 0;
      (this->top_blob_int8_scales).w = 0;
      (this->top_blob_int8_scales).h = 0;
      (this->top_blob_int8_scales).d = 0;
      (this->top_blob_int8_scales).c = 0;
      (this->top_blob_int8_scales).data = local_1b8.data;
      (this->top_blob_int8_scales).refcount =
           (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      (this->top_blob_int8_scales).elemsize = local_1b8.elemsize;
      (this->top_blob_int8_scales).elempack = local_1b8.elempack;
      (this->top_blob_int8_scales).allocator = local_1b8.allocator;
      (this->top_blob_int8_scales).dims = local_1b8.dims;
      (this->top_blob_int8_scales).w = local_1b8.w;
      (this->top_blob_int8_scales).h = local_1b8.h;
      (this->top_blob_int8_scales).d = local_1b8.d;
      (this->top_blob_int8_scales).c = local_1b8.c;
      (this->top_blob_int8_scales).cstep = local_1b8.cstep;
    }
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_170 = CONCAT44(local_170._4_4_,*(this->top_blob_int8_scales).data);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,this->group,4,(Allocator *)0x0);
    if (pMVar1 != &local_1b8) {
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->top_blob_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->top_blob_int8_scales).data;
          pAVar5 = (this->top_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->top_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->top_blob_int8_scales).dims = 0;
      (this->top_blob_int8_scales).w = 0;
      (this->top_blob_int8_scales).h = 0;
      (this->top_blob_int8_scales).d = 0;
      (this->top_blob_int8_scales).c = 0;
      (this->top_blob_int8_scales).data = local_1b8.data;
      (this->top_blob_int8_scales).refcount =
           (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      (this->top_blob_int8_scales).elemsize = local_1b8.elemsize;
      (this->top_blob_int8_scales).elempack = local_1b8.elempack;
      (this->top_blob_int8_scales).allocator = local_1b8.allocator;
      (this->top_blob_int8_scales).dims = local_1b8.dims;
      (this->top_blob_int8_scales).w = local_1b8.w;
      (this->top_blob_int8_scales).h = local_1b8.h;
      (this->top_blob_int8_scales).d = local_1b8.d;
      (this->top_blob_int8_scales).c = local_1b8.c;
      (this->top_blob_int8_scales).cstep = local_1b8.cstep;
    }
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    auVar8 = _DAT_005f2a10;
    auVar7 = _DAT_005ef050;
    auVar6 = _DAT_005ef040;
    uVar9 = (this->top_blob_int8_scales).c * (int)(this->top_blob_int8_scales).cstep;
    if (0 < (int)uVar9) {
      pvVar4 = pMVar1->data;
      lVar10 = (ulong)uVar9 - 1;
      auVar16._8_4_ = (int)lVar10;
      auVar16._0_8_ = lVar10;
      auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar16 = auVar16 ^ _DAT_005ef050;
      do {
        auVar21._8_4_ = (int)uVar11;
        auVar21._0_8_ = uVar11;
        auVar21._12_4_ = (int)(uVar11 >> 0x20);
        auVar23 = (auVar21 | auVar6) ^ auVar7;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar17 && auVar16._0_4_ < auVar23._0_4_ ||
                    iVar17 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4) = (undefined4)local_170;
        }
        if ((auVar23._12_4_ != auVar16._12_4_ || auVar23._8_4_ <= auVar16._8_4_) &&
            auVar23._12_4_ <= auVar16._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = (undefined4)local_170;
        }
        auVar23 = (auVar21 | auVar8) ^ auVar7;
        iVar24 = auVar23._4_4_;
        if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar23._0_4_ <= auVar16._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = (undefined4)local_170;
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = (undefined4)local_170;
        }
        uVar11 = uVar11 + 4;
      } while ((uVar9 + 3 & 0xfffffffc) != uVar11);
    }
  }
  if (((this->weight_data).elemsize == 4) && (this->int8_scale_term != 0)) {
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,this->weight_data_size,1,(Allocator *)0x0);
    bVar14 = (long)local_1b8.c * local_1b8.cstep == 0;
    cVar12 = local_1b8.data == (void *)0x0 || bVar14;
    if (local_1b8.data != (void *)0x0 && !bVar14) {
      local_164 = this->weight_data_size / this->group;
      local_165 = cVar12;
      if (0 < this->group) {
        local_170 = (size_t)local_164;
        lVar10 = 0;
        lVar13 = 0;
        do {
          Option::Option(&local_70);
          local_70.num_threads = 1;
          local_70.blob_allocator = local_1b8.allocator;
          local_70.use_packing_layout = false;
          local_108._16_8_ = (this->weight_data).elemsize;
          local_108._0_8_ = local_108._16_8_ * lVar10 + (long)(this->weight_data).data;
          local_108._24_4_ = (this->weight_data).elempack;
          local_108._32_8_ = (this->weight_data).allocator;
          local_108._8_4_ = 0;
          local_108._12_4_ = 0;
          iStack_dc = local_164;
          local_108._40_4_ = 1;
          uStack_d8 = 0x100000001;
          local_d0 = 1;
          local_c8 = local_170;
          local_158._0_8_ = local_1b8.elemsize * lVar10 + (long)local_1b8.data;
          local_158._8_4_ = 0;
          local_158._12_4_ = 0;
          local_158._16_8_ = local_1b8.elemsize;
          local_158._24_4_ = local_1b8.elempack;
          local_158._32_8_ = local_1b8.allocator;
          iStack_12c = local_164;
          local_158._40_4_ = 1;
          uStack_128 = 0x100000001;
          local_120 = 1;
          local_118 = local_170;
          local_b8._16_8_ = (this->weight_data_int8_scales).elemsize;
          local_b8._0_8_ = local_b8._16_8_ * lVar13 + (long)(this->weight_data_int8_scales).data;
          local_b8._24_4_ = (this->weight_data_int8_scales).elempack;
          local_b8._32_8_ = (this->weight_data_int8_scales).allocator;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          uStack_88 = 0x100000001;
          local_b8._40_8_ = 0x100000001;
          local_80 = 1;
          local_78 = 1;
          quantize_to_int8((Mat *)local_108,(Mat *)local_158,(Mat *)local_b8,&local_70);
          piVar3 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
                if ((void *)local_b8._0_8_ != (void *)0x0) {
                  free((void *)local_b8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_b8._32_8_)[3])();
              }
            }
          }
          local_78 = 0;
          local_b8._0_8_ = (void *)0x0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_8_ = 0;
          local_b8._24_4_ = 0;
          stack0xffffffffffffff70 = (undefined1  [16])0x0;
          local_80 = 0;
          piVar3 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
                if ((void *)local_158._0_8_ != (void *)0x0) {
                  free((void *)local_158._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_158._32_8_)[3])();
              }
            }
          }
          local_118 = 0;
          local_158._0_8_ = (void *)0x0;
          local_158._8_4_ = 0;
          local_158._12_4_ = 0;
          local_158._16_8_ = 0;
          local_158._24_4_ = 0;
          stack0xfffffffffffffed0 = (undefined1  [16])0x0;
          local_120 = 0;
          piVar3 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
                if ((void *)local_108._0_8_ != (void *)0x0) {
                  free((void *)local_108._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_108._32_8_)[3])();
              }
            }
          }
          local_c8 = 0;
          local_108._0_8_ = (void *)0x0;
          local_108._8_4_ = 0;
          local_108._12_4_ = 0;
          local_108._16_8_ = 0;
          local_108._24_4_ = 0;
          stack0xffffffffffffff20 = (undefined1  [16])0x0;
          local_d0 = 0;
          lVar13 = lVar13 + 1;
          lVar10 = lVar10 + local_170;
        } while (lVar13 < this->group);
      }
      cVar12 = local_165;
      if (local_160 != &local_1b8) {
        piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->weight_data).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->weight_data).data;
            pAVar5 = (this->weight_data).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).cstep = 0;
        *(undefined1 (*) [16])((long)&local_160->refcount + 4) = (undefined1  [16])0x0;
        local_160->data = (void *)0x0;
        local_160->refcount = (int *)0x0;
        (this->weight_data).dims = 0;
        (this->weight_data).w = 0;
        (this->weight_data).h = 0;
        (this->weight_data).d = 0;
        (this->weight_data).c = 0;
        (this->weight_data).data = local_1b8.data;
        (this->weight_data).refcount =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        (this->weight_data).elemsize = local_1b8.elemsize;
        (this->weight_data).elempack = local_1b8.elempack;
        (this->weight_data).allocator = local_1b8.allocator;
        (this->weight_data).dims = local_1b8.dims;
        (this->weight_data).w = local_1b8.w;
        (this->weight_data).h = local_1b8.h;
        (this->weight_data).d = local_1b8.d;
        (this->weight_data).c = local_1b8.c;
        (this->weight_data).cstep = local_1b8.cstep;
      }
    }
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (cVar12 != '\0') {
      return -100;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q;
            opt_q.num_threads = 1;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}